

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  secp256k1_gej *psVar8;
  int64_t iVar9;
  int64_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t *puVar14;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  secp256k1_modinv64_signed62 *psVar18;
  secp256k1_modinv64_signed62 *psVar19;
  ulong *extraout_RDX;
  secp256k1_gej *psVar20;
  long lVar21;
  long lVar22;
  secp256k1_gej *psVar23;
  secp256k1_gej *psVar24;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_09;
  long lVar25;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar26;
  secp256k1_gej *psVar27;
  secp256k1_gej *unaff_RBP;
  secp256k1_gej *psVar28;
  ulong uVar29;
  long lVar30;
  secp256k1_gej *a_01;
  secp256k1_modinv64_signed62 *psVar31;
  secp256k1_gej *psVar32;
  secp256k1_gej *psVar33;
  secp256k1_gej *psVar34;
  secp256k1_gej *psVar35;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  secp256k1_modinv64_signed62 *psVar40;
  bool bVar41;
  secp256k1_fe r;
  secp256k1_modinv64_signed62 sStack_2b8;
  secp256k1_modinv64_signed62 sStack_290;
  secp256k1_gej *psStack_268;
  secp256k1_gej *psStack_260;
  secp256k1_modinv64_signed62 *psStack_258;
  ulong uStack_250;
  secp256k1_gej *psStack_248;
  ulong uStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_modinv64_signed62 *psStack_230;
  secp256k1_gej *psStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  secp256k1_gej *psStack_210;
  uint64_t uStack_208;
  uint64_t uStack_200;
  uint64_t uStack_1f8;
  uint64_t uStack_1f0;
  uint64_t uStack_1e8;
  secp256k1_gej *psStack_1e0;
  secp256k1_gej *psStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_gej *psStack_1c8;
  secp256k1_gej *psStack_1c0;
  long lStack_1b8;
  secp256k1_gej *psStack_1b0;
  code *pcStack_1a8;
  uint uStack_19c;
  ulong uStack_198;
  secp256k1_gej *apsStack_190 [2];
  undefined1 auStack_180 [56];
  uint64_t auStack_148 [5];
  secp256k1_modinv64_trans2x2 sStack_120;
  secp256k1_modinv64_signed62 sStack_100;
  secp256k1_modinv64_signed62 sStack_d0;
  secp256k1_gej *psStack_a8;
  secp256k1_fe sStack_48;
  
  psVar27 = a;
  secp256k1_fe_verify(x);
  psVar20 = a;
  secp256k1_gej_verify(a);
  if (a->infinity == 0) {
    secp256k1_fe_sqr(&sStack_48,&a->z);
    secp256k1_fe_mul(&sStack_48,&sStack_48,x);
    iVar6 = secp256k1_fe_equal(&sStack_48,&a->x);
    return iVar6;
  }
  secp256k1_gej_eq_x_var_cold_1();
  psVar28 = psVar27;
  secp256k1_fe_verify(&psVar20->x);
  psVar26 = psVar27;
  secp256k1_fe_verify(&psVar27->x);
  if ((psVar20->x).normalized == 0) {
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar27->x).normalized != 0) {
    uVar7 = 4;
    while( true ) {
      uVar29 = (psVar27->x).n[uVar7];
      uVar11 = (psVar20->x).n[uVar7];
      if (uVar11 >= uVar29 && uVar11 != uVar29) {
        return 1;
      }
      if (uVar11 < uVar29) break;
      bVar41 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar41) {
        return 0;
      }
    }
    return -1;
  }
  secp256k1_fe_cmp_var_cold_1();
  psVar27 = psVar28;
  secp256k1_fe_verify(&psVar26->x);
  psVar20 = psVar28;
  secp256k1_fe_verify(&psVar28->x);
  iVar6 = (psVar28->x).magnitude + (psVar26->x).magnitude;
  if (iVar6 < 0x21) {
    (psVar26->x).n[0] = (psVar26->x).n[0] + (psVar28->x).n[0];
    puVar14 = (psVar26->x).n + 1;
    *puVar14 = *puVar14 + (psVar28->x).n[1];
    puVar14 = (psVar26->x).n + 2;
    *puVar14 = *puVar14 + (psVar28->x).n[2];
    puVar14 = (psVar26->x).n + 3;
    *puVar14 = *puVar14 + (psVar28->x).n[3];
    puVar14 = (psVar26->x).n + 4;
    *puVar14 = *puVar14 + (psVar28->x).n[4];
    (psVar26->x).magnitude = iVar6;
    (psVar26->x).normalized = 0;
    secp256k1_fe_verify(&psVar26->x);
    return extraout_EAX;
  }
  secp256k1_fe_add_cold_1();
  sStack_100.v[2] = 0;
  sStack_100.v[3] = 0;
  sStack_100.v[0] = 0;
  sStack_100.v[1] = 0;
  sStack_100.v[4] = 0;
  sStack_d0.v[3] = 0;
  sStack_d0.v[4] = 0;
  sStack_d0.v[1] = 0;
  sStack_d0.v[2] = 0;
  sStack_d0.v[0] = 1;
  auStack_180._32_8_ = (psVar27->x).n[4];
  auStack_180._0_8_ = (psVar27->x).n[0];
  auStack_180._8_8_ = (psVar27->x).n[1];
  auStack_180._16_8_ = (psVar27->x).n[2];
  auStack_180._24_8_ = (psVar27->x).n[3];
  auStack_148[3] = (psVar20->x).n[4];
  auStack_180._48_8_ = (psVar20->x).n[0];
  auStack_148[0] = (psVar20->x).n[1];
  auStack_148[1] = (psVar20->x).n[2];
  auStack_148[2] = (psVar20->x).n[3];
  uStack_198 = 0;
  lVar39 = -1;
  uStack_19c = 5;
  apsStack_190[0] = psVar20;
  apsStack_190[1] = psVar27;
  psStack_a8 = psVar26;
LAB_00149138:
  psVar27 = (secp256k1_gej *)auStack_180._0_8_;
  psVar23 = apsStack_190[1];
  psVar8 = (secp256k1_gej *)0x0;
  psVar34 = (secp256k1_gej *)0x0;
  psVar32 = (secp256k1_gej *)0x1;
  uVar7 = 0x3e;
  psVar28 = (secp256k1_gej *)0x1;
  uVar29 = auStack_180._48_8_;
  psVar20 = (secp256k1_gej *)auStack_180._0_8_;
  while( true ) {
    a_01 = (secp256k1_gej *)(-1L << ((byte)uVar7 & 0x3f) | uVar29);
    psVar18 = (secp256k1_modinv64_signed62 *)0x0;
    if (a_01 != (secp256k1_gej *)0x0) {
      for (; ((ulong)a_01 >> (long)psVar18 & 1) == 0;
          psVar18 = (secp256k1_modinv64_signed62 *)((long)psVar18->v + 1)) {
      }
    }
    bVar16 = (byte)psVar18;
    psVar33 = (secp256k1_gej *)(uVar29 >> (bVar16 & 0x3f));
    psVar28 = (secp256k1_gej *)((long)psVar28 << (bVar16 & 0x3f));
    psVar8 = (secp256k1_gej *)((long)psVar8 << (bVar16 & 0x3f));
    lVar39 = lVar39 - (long)psVar18;
    uVar7 = uVar7 - (int)psVar18;
    if (uVar7 == 0) break;
    if (((ulong)psVar20 & 1) == 0) {
      pcStack_1a8 = (code *)0x1495b5;
      secp256k1_modinv64_var_cold_8();
LAB_001495b5:
      pcStack_1a8 = (code *)0x1495ba;
      secp256k1_modinv64_var_cold_7();
LAB_001495ba:
      pcStack_1a8 = (code *)0x1495bf;
      secp256k1_modinv64_var_cold_1();
LAB_001495bf:
      pcStack_1a8 = (code *)0x1495c4;
      secp256k1_modinv64_var_cold_2();
LAB_001495c4:
      pcStack_1a8 = (code *)0x1495c9;
      secp256k1_modinv64_var_cold_6();
      psVar33 = psVar20;
      goto LAB_001495c9;
    }
    if (((ulong)psVar33 & 1) == 0) goto LAB_001495b5;
    a_01 = (secp256k1_gej *)((long)psVar8 * auStack_180._48_8_ + (long)psVar28 * auStack_180._0_8_);
    psVar18 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar7);
    bVar16 = (byte)(0x3e - uVar7);
    psVar26 = (secp256k1_gej *)((long)psVar20 << (bVar16 & 0x3f));
    if (a_01 != psVar26) goto LAB_001495ba;
    psVar26 = (secp256k1_gej *)
              ((long)psVar32 * auStack_180._48_8_ + (long)psVar34 * auStack_180._0_8_);
    a_01 = (secp256k1_gej *)((long)psVar33 << (bVar16 & 0x3f));
    if (psVar26 != a_01) goto LAB_001495bf;
    psVar18 = (secp256k1_modinv64_signed62 *)(lVar39 - 0x2ea);
    if (psVar18 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_001495c4;
    iVar6 = (int)psVar33;
    if (lVar39 < 0) {
      lVar39 = -lVar39;
      uVar17 = (int)lVar39 + 1;
      if ((int)uVar7 <= (int)uVar17) {
        uVar17 = uVar7;
      }
      psVar18 = (secp256k1_modinv64_signed62 *)(ulong)uVar17;
      a_01 = (secp256k1_gej *)(ulong)(uVar17 - 0x3f);
      if (0xffffffc1 < uVar17 - 0x3f) {
        psVar24 = (secp256k1_gej *)-(long)psVar8;
        unaff_RBP = (secp256k1_gej *)-(long)psVar28;
        psVar36 = (secp256k1_gej *)-(long)psVar20;
        psVar26 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar17 & 0x3fU)) >> (-(char)uVar17 & 0x3fU));
        uVar17 = (iVar6 * iVar6 + 0x3e) * iVar6 * (int)psVar36 & (uint)psVar26;
        psVar8 = psVar32;
        psVar28 = psVar34;
        unaff_R12 = psVar24;
        goto LAB_00149294;
      }
      goto LAB_001495d3;
    }
    uVar17 = (int)lVar39 + 1;
    if ((int)uVar7 <= (int)uVar17) {
      uVar17 = uVar7;
    }
    psVar18 = (secp256k1_modinv64_signed62 *)(ulong)uVar17;
    a_01 = (secp256k1_gej *)(ulong)(uVar17 - 0x3f);
    if (uVar17 - 0x3f < 0xffffffc2) goto LAB_001495ce;
    psVar26 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar17 & 0x3fU)) >> (-(char)uVar17 & 0x3fU))
    ;
    uVar17 = -(iVar6 * (((int)psVar20 * 2 + 2U & 8) + (int)psVar20)) & (uint)psVar26;
    unaff_RBP = psVar34;
    psVar24 = psVar32;
    psVar36 = psVar33;
    psVar33 = psVar20;
LAB_00149294:
    uVar11 = (ulong)uVar17;
    a_01 = (secp256k1_gej *)(uVar11 * (long)psVar33);
    uVar29 = (long)(psVar36->x).n + (long)(a_01->x).n;
    psVar34 = (secp256k1_gej *)((long)(unaff_RBP->x).n + (long)psVar28 * uVar11);
    psVar18 = (secp256k1_modinv64_signed62 *)(uVar11 * (long)psVar8);
    psVar32 = (secp256k1_gej *)((long)psVar18->v + (long)&psVar24->x);
    psVar20 = psVar33;
    if ((uVar29 & (ulong)psVar26) != 0) {
LAB_001495c9:
      pcStack_1a8 = (code *)0x1495ce;
      secp256k1_modinv64_var_cold_4();
      psVar20 = psVar33;
LAB_001495ce:
      pcStack_1a8 = (code *)0x1495d3;
      secp256k1_modinv64_var_cold_3();
LAB_001495d3:
      pcStack_1a8 = (code *)0x1495d8;
      secp256k1_modinv64_var_cold_5();
      psVar23 = unaff_R12;
      goto LAB_001495d8;
    }
  }
  a_01 = (secp256k1_gej *)((long)psVar8 * (long)psVar34);
  psVar18 = SUB168(SEXT816((long)psVar8) * SEXT816((long)psVar34),8);
  sStack_120.u = (int64_t)psVar28;
  sStack_120.v = (int64_t)psVar8;
  sStack_120.q = (int64_t)psVar34;
  sStack_120.r = (int64_t)psVar32;
  if ((long)psVar28 * (long)psVar32 - (long)a_01 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar28) * SEXT816((long)psVar32),8) - (long)psVar18 !=
      (ulong)((secp256k1_gej *)((long)psVar28 * (long)psVar32) < a_01)) goto LAB_0014960f;
  pcStack_1a8 = (code *)0x149322;
  secp256k1_modinv64_update_de_62
            (&sStack_100,&sStack_d0,&sStack_120,(secp256k1_modinv64_modinfo *)apsStack_190[1]);
  uVar7 = uStack_19c;
  psVar27 = (secp256k1_gej *)auStack_180;
  psVar26 = (secp256k1_gej *)(ulong)uStack_19c;
  psVar28 = (secp256k1_gej *)(ulong)uStack_19c;
  psVar18 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
  pcStack_1a8 = (code *)0x14933f;
  a_01 = psVar27;
  iVar6 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar27,uStack_19c,
                     (secp256k1_modinv64_signed62 *)psVar23,-1);
  psVar20 = (secp256k1_gej *)(auStack_180 + 0x30);
  if (0 < iVar6) {
    psVar18 = (secp256k1_modinv64_signed62 *)0x1;
    psVar28 = (secp256k1_gej *)(ulong)uVar7;
    pcStack_1a8 = (code *)0x14935e;
    a_01 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,1);
    if (0 < iVar6) goto LAB_001495dd;
    psVar28 = (secp256k1_gej *)(ulong)uVar7;
    psVar18 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_1a8 = (code *)0x14937a;
    a_01 = psVar20;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,-1);
    if (iVar6 < 1) goto LAB_001495e2;
    psVar18 = (secp256k1_modinv64_signed62 *)0x1;
    psVar28 = (secp256k1_gej *)(ulong)uVar7;
    pcStack_1a8 = (code *)0x149394;
    a_01 = psVar20;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,1);
    if (-1 < iVar6) goto LAB_001495e7;
    pcStack_1a8 = (code *)0x1493b1;
    secp256k1_modinv64_update_fg_62_var
              (uVar7,(secp256k1_modinv64_signed62 *)psVar27,(secp256k1_modinv64_signed62 *)psVar20,
               &sStack_120);
    if (auStack_180._48_8_ == 0) {
      if (1 < (int)uVar7) {
        uVar29 = 1;
        uVar11 = 0;
        do {
          uVar11 = uVar11 | auStack_148[uVar29 - 1];
          uVar29 = uVar29 + 1;
        } while (uVar7 != uVar29);
        if (uVar11 != 0) goto LAB_001493e1;
      }
      a_01 = (secp256k1_gej *)(auStack_180 + 0x30);
      psVar28 = (secp256k1_gej *)(ulong)uVar7;
      psVar18 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_1a8 = (code *)0x1494c7;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,uVar7,&SECP256K1_SIGNED62_ONE,0);
      if (iVar6 != 0) goto LAB_00149605;
      pcStack_1a8 = (code *)0x1494e9;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_180,uVar7,&SECP256K1_SIGNED62_ONE,-1
                        );
      psVar27 = apsStack_190[0];
      if (iVar6 != 0) {
        pcStack_1a8 = (code *)0x14950a;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_180,uVar7,&SECP256K1_SIGNED62_ONE,
                           1);
        if (iVar6 != 0) {
          psVar28 = (secp256k1_gej *)0x5;
          psVar18 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_1a8 = (code *)0x149524;
          a_01 = psVar27;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar27,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar6 != 0) goto LAB_0014960a;
          a_01 = (secp256k1_gej *)&sStack_100;
          psVar28 = (secp256k1_gej *)0x5;
          psVar18 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_1a8 = (code *)0x149547;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar6 != 0) goto LAB_0014960a;
          a_01 = (secp256k1_gej *)auStack_180;
          psVar18 = (secp256k1_modinv64_signed62 *)0x1;
          psVar28 = (secp256k1_gej *)(ulong)uVar7;
          pcStack_1a8 = (code *)0x149563;
          iVar6 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,uVar7,
                             (secp256k1_modinv64_signed62 *)psVar23,1);
          if (iVar6 != 0) goto LAB_0014960a;
        }
      }
      pcStack_1a8 = (code *)0x149586;
      secp256k1_modinv64_normalize_62
                (&sStack_100,(int64_t)apsStack_190[(long)(int)uVar7 + 1],
                 (secp256k1_modinv64_modinfo *)psVar23);
      (psVar27->x).n[4] = sStack_100.v[4];
      (psVar27->x).n[2] = sStack_100.v[2];
      (psVar27->x).n[3] = sStack_100.v[3];
      (psVar27->x).n[0] = sStack_100.v[0];
      (psVar27->x).n[1] = sStack_100.v[1];
      return (int)sStack_100.v[4];
    }
LAB_001493e1:
    lVar21 = (long)(int)uVar7;
    psVar8 = apsStack_190[lVar21 + 1];
    psVar18 = (secp256k1_modinv64_signed62 *)auStack_148[lVar21 + -2];
    a_01 = (secp256k1_gej *)((long)psVar8 >> 0x3f ^ (ulong)psVar8 | lVar21 + -2 >> 0x3f);
    psVar28 = (secp256k1_gej *)((long)psVar18 >> 0x3f ^ (ulong)psVar18 | (ulong)a_01);
    if (psVar28 == (secp256k1_gej *)0x0) {
      psVar26 = (secp256k1_gej *)(ulong)(uVar7 - 1);
      apsStack_190[lVar21] = (secp256k1_gej *)((ulong)apsStack_190[lVar21] | (long)psVar8 << 0x3e);
      psVar18 = (secp256k1_modinv64_signed62 *)((long)psVar18 << 0x3e);
      auStack_148[lVar21 + -3] = auStack_148[lVar21 + -3] | (ulong)psVar18;
    }
    if ((int)uStack_198 == 0xb) goto LAB_001495ec;
    uVar7 = (uint)psVar26;
    psVar18 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_1a8 = (code *)0x149445;
    psVar28 = psVar26;
    a_01 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,-1);
    if (iVar6 < 1) goto LAB_001495f1;
    psVar18 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_1a8 = (code *)0x14945f;
    psVar28 = psVar26;
    a_01 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,1);
    if (0 < iVar6) goto LAB_001495f6;
    psVar18 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_1a8 = (code *)0x14947b;
    psVar28 = psVar26;
    a_01 = psVar20;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,-1);
    if (iVar6 < 1) goto LAB_001495fb;
    psVar18 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_1a8 = (code *)0x149495;
    psVar28 = psVar26;
    a_01 = psVar20;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar20,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,1);
    if (-1 < iVar6) goto LAB_00149600;
    uStack_198 = (ulong)((int)uStack_198 + 1);
    unaff_R12 = psVar23;
    uStack_19c = uVar7;
    goto LAB_00149138;
  }
LAB_001495d8:
  pcStack_1a8 = (code *)0x1495dd;
  secp256k1_modinv64_var_cold_20();
LAB_001495dd:
  pcStack_1a8 = (code *)0x1495e2;
  secp256k1_modinv64_var_cold_19();
LAB_001495e2:
  pcStack_1a8 = (code *)0x1495e7;
  secp256k1_modinv64_var_cold_18();
LAB_001495e7:
  pcStack_1a8 = (code *)0x1495ec;
  secp256k1_modinv64_var_cold_17();
LAB_001495ec:
  pcStack_1a8 = (code *)0x1495f1;
  secp256k1_modinv64_var_cold_14();
LAB_001495f1:
  pcStack_1a8 = (code *)0x1495f6;
  secp256k1_modinv64_var_cold_13();
LAB_001495f6:
  pcStack_1a8 = (code *)0x1495fb;
  secp256k1_modinv64_var_cold_12();
LAB_001495fb:
  pcStack_1a8 = (code *)0x149600;
  secp256k1_modinv64_var_cold_11();
LAB_00149600:
  pcStack_1a8 = (code *)0x149605;
  secp256k1_modinv64_var_cold_10();
LAB_00149605:
  pcStack_1a8 = (code *)0x14960a;
  secp256k1_modinv64_var_cold_15();
LAB_0014960a:
  pcStack_1a8 = (code *)0x14960f;
  secp256k1_modinv64_var_cold_16();
  unaff_R12 = psVar23;
LAB_0014960f:
  pcStack_1a8 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  uVar29 = (psVar28->x).n[0];
  if (uVar29 >> 0x3e == 0) {
    uVar11 = (psVar28->x).n[1];
    if (0x3fffffffffffffff < uVar11) goto LAB_0014969e;
    psVar18 = (secp256k1_modinv64_signed62 *)(psVar28->x).n[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar18) goto LAB_001496a3;
    uVar12 = (psVar28->x).n[3];
    if (0x3fffffffffffffff < uVar12) goto LAB_001496a8;
    psVar28 = (secp256k1_gej *)(psVar28->x).n[4];
    if (psVar28 < (secp256k1_gej *)0x100) {
      (a_01->x).n[0] = uVar11 << 0x3e | uVar29;
      (a_01->x).n[1] = (long)psVar18 << 0x3c | uVar11 >> 2;
      (a_01->x).n[2] = uVar12 << 0x3a | (ulong)psVar18 >> 4;
      (a_01->x).n[3] = (long)psVar28 << 0x38 | uVar12 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return extraout_EAX_00;
    }
  }
  else {
    psStack_1b0 = (secp256k1_gej *)0x14969e;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014969e:
    psStack_1b0 = (secp256k1_gej *)0x1496a3;
    secp256k1_scalar_from_signed62_cold_4();
LAB_001496a3:
    psStack_1b0 = (secp256k1_gej *)0x1496a8;
    secp256k1_scalar_from_signed62_cold_3();
LAB_001496a8:
    psStack_1b0 = (secp256k1_gej *)0x1496ad;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_1b0 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_1b0 = unaff_RBP;
  lStack_1b8 = lVar39;
  psStack_1c0 = psVar27;
  psStack_1c8 = psVar20;
  psStack_1d0 = unaff_R12;
  psStack_1d8 = psVar26;
  uVar1 = (a_01->x).n[0];
  uStack_1f8 = (a_01->x).n[1];
  uStack_200 = (a_01->x).n[2];
  uStack_208 = (a_01->x).n[3];
  uStack_218 = (a_01->x).n[4];
  uVar2 = (psVar28->x).n[0];
  psStack_1e0 = (secp256k1_gej *)(psVar28->x).n[1];
  uVar3 = (psVar28->x).n[2];
  uStack_240 = *extraout_RDX;
  psStack_238 = (secp256k1_gej *)extraout_RDX[1];
  uStack_250 = extraout_RDX[2];
  psStack_248 = (secp256k1_gej *)extraout_RDX[3];
  uStack_1e8 = (psVar28->x).n[3];
  uStack_220 = (psVar28->x).n[4];
  uVar29 = 5;
  psVar26 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_258 = (secp256k1_modinv64_signed62 *)0x149748;
  psVar20 = a_01;
  iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar18,-2);
  psVar27 = psVar28;
  if (iVar6 < 1) {
LAB_0014a1ed:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a1f2;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014a1f2:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a1f7;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014a1f7:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a1fc;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014a1fc:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a201;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014a201:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a206;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar40 = psVar18;
LAB_0014a206:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a20b;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014a20b:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a210;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar18 = psVar40;
LAB_0014a210:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a215;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_0014a215:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a21a;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014a21a:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a21f;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_0014a21f:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a224;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014a224:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a229;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014a229:
    psVar23 = psVar20;
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a22e;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014a22e:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a233;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014a233:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a238;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014a238:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a23d;
    secp256k1_modinv64_update_de_62_cold_9();
    psVar20 = psVar23;
LAB_0014a23d:
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14a242;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar26 = (secp256k1_gej *)0x1;
    uVar29 = 5;
    psStack_258 = (secp256k1_modinv64_signed62 *)0x14976a;
    psVar20 = a_01;
    psStack_210 = a_01;
    iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar18,1);
    if (-1 < iVar6) goto LAB_0014a1f2;
    uVar29 = 5;
    psVar26 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_258 = (secp256k1_modinv64_signed62 *)0x149789;
    psVar20 = psVar28;
    iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar28,5,psVar18,-2);
    if (iVar6 < 1) goto LAB_0014a1f7;
    psVar26 = (secp256k1_gej *)0x1;
    uVar29 = 5;
    psStack_258 = (secp256k1_modinv64_signed62 *)0x1497a6;
    psVar20 = psVar28;
    iVar6 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar28,5,psVar18,1);
    if (-1 < iVar6) goto LAB_0014a1fc;
    psVar27 = (secp256k1_gej *)0x3fffffffffffffff;
    psStack_258 = (secp256k1_modinv64_signed62 *)0x1497cc;
    psStack_228 = psVar28;
    uStack_1f0 = uVar3;
    iVar9 = secp256k1_modinv64_abs(uStack_240);
    psStack_258 = (secp256k1_modinv64_signed62 *)0x1497d9;
    psVar20 = psStack_238;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_238);
    psVar26 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    if ((long)psVar26 < iVar9) goto LAB_0014a201;
    psStack_258 = (secp256k1_modinv64_signed62 *)0x1497f4;
    iVar9 = secp256k1_modinv64_abs(uStack_250);
    psStack_258 = (secp256k1_modinv64_signed62 *)0x149801;
    psVar20 = psStack_248;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_248);
    psVar26 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    psVar40 = psVar18;
    if ((long)psVar26 < iVar9) goto LAB_0014a206;
    uVar29 = uStack_240 * uVar1;
    psVar26 = SUB168(SEXT816((long)uStack_240) * SEXT816((long)uVar1),8);
    uVar11 = (long)psStack_238 * uVar2;
    psVar20 = SUB168(SEXT816((long)psStack_238) * SEXT816((long)uVar2),8);
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    lVar39 = (0x7fffffffffffffff - (long)psVar20) - (long)psVar26;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar20,(long)psVar26) !=
        SBORROW8(lVar39,(ulong)(~uVar11 < uVar29))) !=
        (long)(lVar39 - (ulong)(~uVar11 < uVar29)) < 0 && -1 < (long)psVar20) goto LAB_0014a23d;
    psVar28 = (secp256k1_gej *)(uVar11 + uVar29);
    psVar20 = (secp256k1_gej *)
              ((long)(psVar26->x).n + (long)(psVar20->x).n + (ulong)CARRY8(uVar11,uVar29));
    uVar12 = uStack_250 * uVar1;
    lVar21 = SUB168(SEXT816((long)uStack_250) * SEXT816((long)uVar1),8);
    uVar13 = (long)psStack_248 * uVar2;
    lVar22 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)uVar2),8);
    uVar11 = (ulong)(-uVar13 - 1 < uVar12);
    lVar39 = (0x7fffffffffffffff - lVar22) - lVar21;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar22,lVar21) != SBORROW8(lVar39,uVar11)) !=
             (long)(lVar39 - uVar11) < 0;
    psVar26 = (secp256k1_gej *)CONCAT71((int7)(-uVar13 - 1 >> 8),bVar41 && -1 < lVar22);
    if (!bVar41 || -1 >= lVar22) {
      psVar40 = (secp256k1_modinv64_signed62 *)((long)uStack_218 >> 0x3f);
      psVar26 = (secp256k1_gej *)((long)uStack_220 >> 0x3f);
      lVar30 = ((ulong)psStack_238 & (ulong)psVar26) + (uStack_240 & (ulong)psVar40);
      psVar8 = (secp256k1_gej *)(uVar13 + uVar12);
      lVar21 = lVar22 + lVar21 + (ulong)CARRY8(uVar13,uVar12);
      lVar39 = psVar18->v[0];
      uVar11 = psVar18[1].v[0];
      uVar29 = lVar30 - (uVar11 * (long)psVar28 + lVar30 & 0x3fffffffffffffff);
      puVar14 = (uint64_t *)(uVar29 * lVar39);
      psVar23 = SUB168(SEXT816((long)uVar29) * SEXT816(lVar39),8);
      psStack_230 = psVar18;
      if ((long)psVar23 < 0) {
        lVar30 = (-0x8000000000000000 - (long)psVar23) - (ulong)(puVar14 != (uint64_t *)0x0);
        lVar22 = (long)psVar20 - lVar30;
        if ((SBORROW8((long)psVar20,lVar30) !=
            SBORROW8(lVar22,(ulong)(psVar28 < (secp256k1_gej *)-(long)puVar14))) ==
            (long)(lVar22 - (ulong)(psVar28 < (secp256k1_gej *)-(long)puVar14)) < 0)
        goto LAB_0014992f;
LAB_00149af0:
        psStack_258 = (secp256k1_modinv64_signed62 *)0x149af5;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00149af5:
        lVar30 = (-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0);
        lVar22 = lVar21 - lVar30;
        if ((SBORROW8(lVar21,lVar30) != SBORROW8(lVar22,(ulong)(psVar8 < (secp256k1_gej *)-uVar11)))
            == (long)(lVar22 - (ulong)(psVar8 < (secp256k1_gej *)-uVar11)) < 0) goto LAB_0014997f;
LAB_00149b17:
        psStack_258 = (secp256k1_modinv64_signed62 *)0x149b1c;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar12 = extraout_RAX;
        lVar21 = extraout_RDX_00;
LAB_00149b1c:
        psVar32 = (secp256k1_gej *)((-0x8000000000000000 - lVar21) - (ulong)(uVar12 != 0));
        psVar20 = (secp256k1_gej *)
                  (((long)psVar28 - (long)psVar32) - (ulong)(psVar8 < (secp256k1_gej *)-uVar12));
        if ((SBORROW8((long)psVar28,(long)psVar32) !=
            SBORROW8((long)psVar28 - (long)psVar32,(ulong)(psVar8 < (secp256k1_gej *)-uVar12))) ==
            (long)psVar20 < 0) {
LAB_00149a02:
          uVar11 = uVar11 >> 0x3e | lVar39 << 2;
          bVar41 = CARRY8((ulong)psVar8,uVar12);
          psVar8 = (secp256k1_gej *)((long)(psVar8->x).n + uVar12);
          psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + (ulong)bVar41 + lVar21);
          psVar32 = (secp256k1_gej *)(uStack_250 * uStack_1f8 + uVar11);
          psVar20 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_250) * SEXT816((long)uStack_1f8),8) +
                     (lVar39 >> 0x3e) + (ulong)CARRY8(uStack_250 * uStack_1f8,uVar11));
          uVar11 = (long)psStack_248 * (long)psVar23;
          lVar39 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)psVar23),8);
          if (lVar39 < 0) goto LAB_00149b46;
          uVar12 = (ulong)((secp256k1_gej *)(-1 - uVar11) < psVar32);
          lVar21 = (0x7fffffffffffffff - lVar39) - (long)psVar20;
          psVar18 = (secp256k1_modinv64_signed62 *)(lVar21 - uVar12);
          if ((SBORROW8(0x7fffffffffffffff - lVar39,(long)psVar20) != SBORROW8(lVar21,uVar12)) !=
              (long)psVar18 < 0) goto LAB_00149b5e;
        }
        else {
LAB_00149b41:
          psStack_258 = (secp256k1_modinv64_signed62 *)0x149b46;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar11 = extraout_RAX_00;
          lVar39 = extraout_RDX_01;
LAB_00149b46:
          psVar18 = (secp256k1_modinv64_signed62 *)
                    ((-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0));
          if ((SBORROW8((long)psVar20,(long)psVar18) !=
              SBORROW8((long)psVar20 - (long)psVar18,(ulong)(psVar32 < (secp256k1_gej *)-uVar11)))
              != (long)(((long)psVar20 - (long)psVar18) -
                       (ulong)(psVar32 < (secp256k1_gej *)-uVar11)) < 0) {
LAB_00149b5e:
            psStack_258 = (secp256k1_modinv64_signed62 *)0x149b63;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00149b69;
          }
        }
        bVar41 = CARRY8((ulong)psVar32,uVar11);
        psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + uVar11);
        psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + (ulong)bVar41 + lVar39);
        psVar34 = (secp256k1_gej *)psStack_230->v[1];
        psVar18 = psStack_230;
        if (psVar34 == (secp256k1_gej *)0x0) goto LAB_00149b69;
        psVar33 = (secp256k1_gej *)((long)psVar34 * uVar29);
        psVar24 = SUB168(SEXT816((long)psVar34) * SEXT816((long)uVar29),8);
        if ((long)psVar24 < 0) goto LAB_0014a103;
        uVar11 = (ulong)((secp256k1_gej *)(-(long)psVar33 - 1U) < psVar8);
        lVar39 = (0x7fffffffffffffff - (long)psVar24) - (long)psVar28;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar24,(long)psVar28) != SBORROW8(lVar39,uVar11))
            != (long)(lVar39 - uVar11) < 0) goto LAB_0014a125;
LAB_00149a9c:
        bVar41 = CARRY8((ulong)psVar33,(ulong)psVar8);
        psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + (long)(psVar8->x).n);
        psVar24 = (secp256k1_gej *)((long)(psVar28->x).n + (long)(psVar24->x).n + (ulong)bVar41);
        uVar11 = (long)psVar34 * (long)psVar26;
        lVar39 = SUB168(SEXT816((long)psVar34) * SEXT816((long)psVar26),8);
        if (lVar39 < 0) goto LAB_0014a12a;
        psVar28 = (secp256k1_gej *)(-1 - uVar11);
        lVar21 = ((long)a_01 - lVar39) - (long)psVar20;
        psVar8 = (secp256k1_gej *)(lVar21 - (ulong)(psVar28 < psVar32));
        if ((SBORROW8((long)a_01 - lVar39,(long)psVar20) !=
            SBORROW8(lVar21,(ulong)(psVar28 < psVar32))) != (long)psVar8 < 0) goto LAB_0014a14c;
LAB_00149acd:
        bVar41 = CARRY8((ulong)psVar32,uVar11);
        psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + uVar11);
        psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + (ulong)bVar41 + lVar39);
        psVar28 = psVar24;
        psVar8 = psVar33;
LAB_00149b69:
        psVar24 = psStack_210;
        uVar11 = (long)psVar28 << 2 | (ulong)psVar8 >> 0x3e;
        psVar23 = (secp256k1_gej *)(uStack_240 * uStack_200 + uVar11);
        psVar34 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_240) * SEXT816((long)uStack_200),8) +
                   ((long)psVar28 >> 0x3e) + (ulong)CARRY8(uStack_240 * uStack_200,uVar11));
        (psStack_210->x).n[0] = (ulong)psVar8 & 0x3fffffffffffffff;
        uVar11 = (long)psStack_238 * uStack_1f0;
        lVar39 = SUB168(SEXT816((long)psStack_238) * SEXT816((long)uStack_1f0),8);
        (psStack_228->x).n[0] = (ulong)psVar32 & 0x3fffffffffffffff;
        if (lVar39 < 0) {
          psVar8 = (secp256k1_gej *)((-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0));
          psVar28 = (secp256k1_gej *)
                    (((long)psVar34 - (long)psVar8) - (ulong)(psVar23 < (secp256k1_gej *)-uVar11));
          if ((SBORROW8((long)psVar34,(long)psVar8) !=
              SBORROW8((long)psVar34 - (long)psVar8,(ulong)(psVar23 < (secp256k1_gej *)-uVar11))) ==
              (long)psVar28 < 0) goto LAB_00149bd7;
LAB_00149cc7:
          psStack_258 = (secp256k1_modinv64_signed62 *)0x149ccc;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar11 = extraout_RAX_01;
          lVar39 = extraout_RDX_02;
LAB_00149ccc:
          lVar22 = (-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0);
          lVar21 = (long)psVar28 - lVar22;
          if ((SBORROW8((long)psVar28,lVar22) !=
              SBORROW8(lVar21,(ulong)(psVar8 < (secp256k1_gej *)-uVar11))) !=
              (long)(lVar21 - (ulong)(psVar8 < (secp256k1_gej *)-uVar11)) < 0) {
LAB_00149cee:
            psStack_258 = (secp256k1_modinv64_signed62 *)0x149cf3;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_00149cf9;
          }
        }
        else {
          psVar28 = (secp256k1_gej *)(-1 - uVar11);
          lVar21 = ((long)a_01 - lVar39) - (long)psVar34;
          psVar8 = (secp256k1_gej *)(lVar21 - (ulong)(psVar28 < psVar23));
          if ((SBORROW8((long)a_01 - lVar39,(long)psVar34) !=
              SBORROW8(lVar21,(ulong)(psVar28 < psVar23))) != (long)psVar8 < 0) goto LAB_00149cc7;
LAB_00149bd7:
          uVar12 = (ulong)psVar32 >> 0x3e | (long)psVar20 << 2;
          bVar41 = CARRY8((ulong)psVar23,uVar11);
          psVar23 = (secp256k1_gej *)((long)(psVar23->x).n + uVar11);
          psVar34 = (secp256k1_gej *)((long)(psVar34->x).n + (ulong)bVar41 + lVar39);
          psVar8 = (secp256k1_gej *)(uStack_250 * uStack_200 + uVar12);
          psVar28 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_250) * SEXT816((long)uStack_200),8) +
                     ((long)psVar20 >> 0x3e) + (ulong)CARRY8(uStack_250 * uStack_200,uVar12));
          uVar11 = (long)psStack_248 * uStack_1f0;
          lVar39 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)uStack_1f0),8);
          if (lVar39 < 0) goto LAB_00149ccc;
          uVar12 = (ulong)((secp256k1_gej *)(-1 - uVar11) < psVar8);
          lVar21 = ((long)a_01 - lVar39) - (long)psVar28;
          if ((SBORROW8((long)a_01 - lVar39,(long)psVar28) != SBORROW8(lVar21,uVar12)) !=
              (long)(lVar21 - uVar12) < 0) goto LAB_00149cee;
        }
        bVar41 = CARRY8((ulong)psVar8,uVar11);
        psVar8 = (secp256k1_gej *)((long)(psVar8->x).n + uVar11);
        psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + (ulong)bVar41 + lVar39);
        psVar33 = (secp256k1_gej *)psVar18->v[2];
        if (psVar33 == (secp256k1_gej *)0x0) goto LAB_00149cf9;
        psVar20 = (secp256k1_gej *)((long)psVar33 * uVar29);
        psVar32 = SUB168(SEXT816((long)psVar33) * SEXT816((long)uVar29),8);
        if ((long)psVar32 < 0) goto LAB_0014a151;
        uVar11 = (ulong)((secp256k1_gej *)(-(long)psVar20 - 1U) < psVar23);
        lVar39 = ((long)a_01 - (long)psVar32) - (long)psVar34;
        psVar36 = psVar23;
        if ((SBORROW8((long)a_01 - (long)psVar32,(long)psVar34) != SBORROW8(lVar39,uVar11)) !=
            (long)(lVar39 - uVar11) < 0) goto LAB_0014a173;
LAB_00149c6c:
        bVar41 = CARRY8((ulong)psVar20,(ulong)psVar36);
        psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + (long)(psVar36->x).n);
        psVar32 = (secp256k1_gej *)((long)(psVar34->x).n + (long)(psVar32->x).n + (ulong)bVar41);
        uVar11 = (long)psVar33 * (long)psVar26;
        lVar39 = SUB168(SEXT816((long)psVar33) * SEXT816((long)psVar26),8);
        if (lVar39 < 0) goto LAB_0014a178;
        psVar35 = (secp256k1_gej *)(-1 - uVar11);
        lVar21 = ((long)a_01 - lVar39) - (long)psVar28;
        psVar18 = (secp256k1_modinv64_signed62 *)(lVar21 - (ulong)(psVar35 < psVar8));
        psVar23 = psVar20;
        psVar34 = psVar32;
        if ((SBORROW8((long)a_01 - lVar39,(long)psVar28) !=
            SBORROW8(lVar21,(ulong)(psVar35 < psVar8))) != (long)psVar18 < 0) goto LAB_0014a19a;
LAB_00149c9d:
        bVar41 = CARRY8((ulong)psVar8,uVar11);
        psVar8 = (secp256k1_gej *)((long)(psVar8->x).n + uVar11);
        psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + (ulong)bVar41 + lVar39);
LAB_00149cf9:
        uVar11 = (long)psVar34 << 2 | (ulong)psVar23 >> 0x3e;
        psVar36 = (secp256k1_gej *)(uStack_240 * uStack_208 + uVar11);
        psVar35 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_240) * SEXT816((long)uStack_208),8) +
                   ((long)psVar34 >> 0x3e) + (ulong)CARRY8(uStack_240 * uStack_208,uVar11));
        (psVar24->x).n[1] = (ulong)psVar23 & 0x3fffffffffffffff;
        uVar11 = (long)psStack_238 * uStack_1e8;
        lVar39 = SUB168(SEXT816((long)psStack_238) * SEXT816((long)uStack_1e8),8);
        (psStack_228->x).n[1] = (ulong)psVar8 & 0x3fffffffffffffff;
        if (lVar39 < 0) {
          uVar12 = (-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0);
          psVar20 = (secp256k1_gej *)
                    (((long)psVar35 - uVar12) - (ulong)(psVar36 < (secp256k1_gej *)-uVar11));
          if ((SBORROW8((long)psVar35,uVar12) !=
              SBORROW8((long)psVar35 - uVar12,(ulong)(psVar36 < (secp256k1_gej *)-uVar11))) ==
              (long)psVar20 < 0) goto LAB_00149d65;
LAB_00149dcf:
          psStack_258 = (secp256k1_modinv64_signed62 *)0x149dd4;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar11 = extraout_RAX_02;
          lVar39 = extraout_RDX_03;
LAB_00149dd4:
          lVar22 = (-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0);
          lVar21 = (long)psVar20 - lVar22;
          bVar41 = SBORROW8((long)psVar20,lVar22) != SBORROW8(lVar21,(ulong)(uVar12 < -uVar11));
          lVar21 = lVar21 - (ulong)(uVar12 < -uVar11);
        }
        else {
          psVar20 = (secp256k1_gej *)(-1 - uVar11);
          lVar21 = ((long)a_01 - lVar39) - (long)psVar35;
          uVar12 = lVar21 - (ulong)(psVar20 < psVar36);
          if ((SBORROW8((long)a_01 - lVar39,(long)psVar35) !=
              SBORROW8(lVar21,(ulong)(psVar20 < psVar36))) != (long)uVar12 < 0) goto LAB_00149dcf;
LAB_00149d65:
          uVar13 = (ulong)psVar8 >> 0x3e | (long)psVar28 << 2;
          bVar41 = CARRY8((ulong)psVar36,uVar11);
          psVar36 = (secp256k1_gej *)((long)(psVar36->x).n + uVar11);
          psVar35 = (secp256k1_gej *)((long)(psVar35->x).n + (ulong)bVar41 + lVar39);
          uVar12 = uStack_250 * uStack_208 + uVar13;
          psVar20 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_250) * SEXT816((long)uStack_208),8) +
                     ((long)psVar28 >> 0x3e) + (ulong)CARRY8(uStack_250 * uStack_208,uVar13));
          uVar11 = (long)psStack_248 * uStack_1e8;
          lVar39 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)uStack_1e8),8);
          if (lVar39 < 0) goto LAB_00149dd4;
          uVar13 = (ulong)(-uVar11 - 1 < uVar12);
          lVar21 = ((long)a_01 - lVar39) - (long)psVar20;
          bVar41 = SBORROW8((long)a_01 - lVar39,(long)psVar20) != SBORROW8(lVar21,uVar13);
          lVar21 = lVar21 - uVar13;
        }
        psVar18 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar41 != lVar21 < 0) goto LAB_0014a215;
        psVar32 = (secp256k1_gej *)(uVar12 + uVar11);
        psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + (ulong)CARRY8(uVar12,uVar11) + lVar39);
        psVar28 = (secp256k1_gej *)psStack_230->v[3];
        if (psVar28 == (secp256k1_gej *)0x0) goto LAB_00149e73;
        psVar33 = (secp256k1_gej *)((long)psVar28 * uVar29);
        psVar24 = SUB168(SEXT816((long)psVar28) * SEXT816((long)uVar29),8);
        if ((long)psVar24 < 0) goto LAB_0014a19f;
        uVar11 = (ulong)((secp256k1_gej *)(-(long)psVar33 - 1U) < psVar36);
        lVar39 = ((long)a_01 - (long)psVar24) - (long)psVar35;
        if ((SBORROW8((long)a_01 - (long)psVar24,(long)psVar35) != SBORROW8(lVar39,uVar11)) !=
            (long)(lVar39 - uVar11) < 0) goto LAB_0014a1c1;
LAB_00149e34:
        bVar41 = CARRY8((ulong)psVar33,(ulong)psVar36);
        psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + (long)(psVar36->x).n);
        psVar24 = (secp256k1_gej *)((long)(psVar35->x).n + (long)(psVar24->x).n + (ulong)bVar41);
        uVar11 = (long)psVar28 * (long)psVar26;
        lVar39 = SUB168(SEXT816((long)psVar28) * SEXT816((long)psVar26),8);
        if (lVar39 < 0) goto LAB_0014a1c6;
        uVar12 = (ulong)((secp256k1_gej *)(-1 - uVar11) < psVar32);
        lVar21 = ((long)a_01 - lVar39) - (long)psVar20;
        psVar35 = psVar24;
        psVar36 = psVar33;
        if ((SBORROW8((long)a_01 - lVar39,(long)psVar20) != SBORROW8(lVar21,uVar12)) ==
            (long)(lVar21 - uVar12) < 0) {
          do {
            bVar41 = CARRY8((ulong)psVar32,uVar11);
            psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + uVar11);
            psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + (ulong)bVar41 + lVar39);
LAB_00149e73:
            psVar23 = psStack_210;
            uVar11 = (long)psVar35 << 2 | (ulong)psVar36 >> 0x3e;
            psVar36 = (secp256k1_gej *)((ulong)psVar36 & 0x3fffffffffffffff);
            psVar8 = (secp256k1_gej *)(uStack_240 * uStack_218 + uVar11);
            psVar28 = (secp256k1_gej *)
                      (SUB168(SEXT816((long)uStack_240) * SEXT816((long)uStack_218),8) +
                       ((long)psVar35 >> 0x3e) + (ulong)CARRY8(uStack_240 * uStack_218,uVar11));
            (psStack_210->x).n[2] = (uint64_t)psVar36;
            uVar11 = (long)psStack_238 * uStack_220;
            lVar39 = SUB168(SEXT816((long)psStack_238) * SEXT816((long)uStack_220),8);
            (psStack_228->x).n[2] = (ulong)psVar32 & 0x3fffffffffffffff;
            if (lVar39 < 0) {
              lVar22 = (-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0);
              lVar21 = (long)psVar28 - lVar22;
              psVar34 = (secp256k1_gej *)(lVar21 - (ulong)(psVar8 < (secp256k1_gej *)-uVar11));
              if ((SBORROW8((long)psVar28,lVar22) !=
                  SBORROW8(lVar21,(ulong)(psVar8 < (secp256k1_gej *)-uVar11))) == (long)psVar34 < 0)
              goto LAB_00149ee1;
LAB_00149f4d:
              psStack_258 = (secp256k1_modinv64_signed62 *)0x149f52;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar11 = extraout_RAX_03;
              lVar39 = extraout_RDX_04;
LAB_00149f52:
              lVar22 = (-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0);
              lVar21 = (long)psVar34 - lVar22;
              bVar41 = SBORROW8((long)psVar34,lVar22) !=
                       SBORROW8(lVar21,(ulong)(psVar36 < (secp256k1_gej *)-uVar11));
              psVar20 = (secp256k1_gej *)(lVar21 - (ulong)(psVar36 < (secp256k1_gej *)-uVar11));
              psVar32 = psVar20;
            }
            else {
              psVar34 = (secp256k1_gej *)(-1 - uVar11);
              lVar21 = ((long)a_01 - lVar39) - (long)psVar28;
              if ((SBORROW8((long)a_01 - lVar39,(long)psVar28) !=
                  SBORROW8(lVar21,(ulong)(psVar34 < psVar8))) !=
                  (long)(lVar21 - (ulong)(psVar34 < psVar8)) < 0) goto LAB_00149f4d;
LAB_00149ee1:
              uVar12 = (ulong)psVar32 >> 0x3e | (long)psVar20 << 2;
              bVar41 = CARRY8((ulong)psVar8,uVar11);
              psVar8 = (secp256k1_gej *)((long)(psVar8->x).n + uVar11);
              psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + (ulong)bVar41 + lVar39);
              psVar36 = (secp256k1_gej *)(uStack_250 * uStack_218 + uVar12);
              psVar34 = (secp256k1_gej *)
                        (SUB168(SEXT816((long)uStack_250) * SEXT816((long)uStack_218),8) +
                         ((long)psVar20 >> 0x3e) + (ulong)CARRY8(uStack_250 * uStack_218,uVar12));
              uVar11 = (long)psStack_248 * uStack_220;
              lVar39 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)uStack_220),8);
              if (lVar39 < 0) goto LAB_00149f52;
              psVar20 = (secp256k1_gej *)(-1 - uVar11);
              lVar21 = ((long)a_01 - lVar39) - (long)psVar34;
              bVar41 = SBORROW8((long)a_01 - lVar39,(long)psVar34) !=
                       SBORROW8(lVar21,(ulong)(psVar20 < psVar36));
              psVar32 = (secp256k1_gej *)(lVar21 - (ulong)(psVar20 < psVar36));
            }
            psVar18 = psStack_230;
            psVar24 = (secp256k1_gej *)0x8000000000000000;
            if (bVar41 != (long)psVar32 < 0) goto LAB_0014a21a;
            psVar33 = (secp256k1_gej *)((long)(psVar36->x).n + uVar11);
            psVar34 = (secp256k1_gej *)
                      ((long)(psVar34->x).n + (ulong)CARRY8((ulong)psVar36,uVar11) + lVar39);
            psVar32 = (secp256k1_gej *)psStack_230->v[4];
            psVar20 = (secp256k1_gej *)((long)psVar32 * uVar29);
            uVar29 = SUB168(SEXT816((long)psVar32) * SEXT816((long)uVar29),8);
            if ((long)uVar29 < 0) {
              lVar21 = (-0x8000000000000000 - uVar29) - (ulong)(psVar20 != (secp256k1_gej *)0x0);
              lVar39 = (long)psVar28 - lVar21;
              if ((SBORROW8((long)psVar28,lVar21) !=
                  SBORROW8(lVar39,(ulong)(psVar8 < (secp256k1_gej *)-(long)psVar20))) ==
                  (long)(lVar39 - (ulong)(psVar8 < (secp256k1_gej *)-(long)psVar20)) < 0)
              goto LAB_00149fad;
LAB_0014a0de:
              psStack_258 = (secp256k1_modinv64_signed62 *)0x14a0e3;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar11 = extraout_RAX_04;
              lVar39 = extraout_RDX_05;
LAB_0014a0e3:
              psVar28 = (secp256k1_gej *)((-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0));
              psVar26 = (secp256k1_gej *)
                        (((long)psVar34 - (long)psVar28) -
                        (ulong)(psVar33 < (secp256k1_gej *)-uVar11));
              if ((SBORROW8((long)psVar34,(long)psVar28) !=
                  SBORROW8((long)psVar34 - (long)psVar28,(ulong)(psVar33 < (secp256k1_gej *)-uVar11)
                          )) == (long)psVar26 < 0) {
LAB_00149fdb:
                a_01 = psStack_228;
                uVar12 = (long)(psVar33->x).n + uVar11;
                lVar39 = (long)(psVar34->x).n + (ulong)CARRY8(uVar11,(ulong)psVar33) + lVar39;
                psVar26 = (secp256k1_gej *)(uVar29 << 2 | (ulong)psVar20 >> 0x3e);
                (psVar23->x).n[3] = (ulong)psVar20 & 0x3fffffffffffffff;
                psVar27 = (secp256k1_gej *)(uVar12 & 0x3fffffffffffffff);
                (psStack_228->x).n[3] = (uint64_t)psVar27;
                psVar20 = (secp256k1_gej *)&psVar26[0xd79435e50d7942].z;
                uVar29 = ((long)uVar29 >> 0x3e) + -1 +
                         (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar26);
                if (uVar29 != 0xffffffffffffffff) goto LAB_0014a21f;
                uVar29 = 0xffffffffffffffff;
                uVar11 = uVar12 >> 0x3e | lVar39 * 4;
                (psVar23->x).n[4] = (uint64_t)psVar26;
                if ((lVar39 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar11) != -1)
                goto LAB_0014a224;
                (psStack_228->x).n[4] = uVar11;
                uVar29 = 5;
                psVar26 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_258 = (secp256k1_modinv64_signed62 *)0x14a053;
                psVar20 = psVar23;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar23,5,psVar18,-2);
                if (iVar6 < 1) goto LAB_0014a229;
                psVar26 = (secp256k1_gej *)0x1;
                uVar29 = 5;
                psStack_258 = (secp256k1_modinv64_signed62 *)0x14a070;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar23,5,psVar18,1);
                if (-1 < iVar6) goto LAB_0014a22e;
                uVar29 = 5;
                psVar26 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_258 = (secp256k1_modinv64_signed62 *)0x14a08f;
                psVar23 = a_01;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar18,-2);
                if (iVar6 < 1) goto LAB_0014a233;
                psVar26 = (secp256k1_gej *)0x1;
                uVar29 = 5;
                psStack_258 = (secp256k1_modinv64_signed62 *)0x14a0ac;
                psVar23 = a_01;
                iVar6 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar18,1);
                if (iVar6 < 0) {
                  return iVar6;
                }
                goto LAB_0014a238;
              }
            }
            else {
              uVar11 = (ulong)((secp256k1_gej *)(-(long)psVar20 - 1U) < psVar8);
              lVar39 = ((long)a_01 - uVar29) - (long)psVar28;
              if ((SBORROW8((long)a_01 - uVar29,(long)psVar28) != SBORROW8(lVar39,uVar11)) !=
                  (long)(lVar39 - uVar11) < 0) goto LAB_0014a0de;
LAB_00149fad:
              bVar41 = CARRY8((ulong)psVar20,(ulong)psVar8);
              psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + (long)(psVar8->x).n);
              uVar29 = (long)(psVar28->x).n + bVar41 + uVar29;
              uVar11 = (long)psVar32 * (long)psVar26;
              lVar39 = SUB168(SEXT816((long)psVar32) * SEXT816((long)psVar26),8);
              if (lVar39 < 0) goto LAB_0014a0e3;
              psVar26 = (secp256k1_gej *)(-uVar11 - 1);
              lVar21 = (long)a_01 - lVar39;
              lVar22 = lVar21 - (long)psVar34;
              a_01 = (secp256k1_gej *)(lVar22 - (ulong)(psVar26 < psVar33));
              if ((SBORROW8(lVar21,(long)psVar34) != SBORROW8(lVar22,(ulong)(psVar26 < psVar33))) ==
                  (long)a_01 < 0) goto LAB_00149fdb;
            }
            psStack_258 = (secp256k1_modinv64_signed62 *)0x14a103;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_0014a103:
            lVar21 = (-0x8000000000000000 - (long)psVar24) -
                     (ulong)(psVar33 != (secp256k1_gej *)0x0);
            lVar39 = (long)psVar28 - lVar21;
            if ((SBORROW8((long)psVar28,lVar21) !=
                SBORROW8(lVar39,(ulong)(psVar8 < (secp256k1_gej *)-(long)psVar33))) ==
                (long)(lVar39 - (ulong)(psVar8 < (secp256k1_gej *)-(long)psVar33)) < 0)
            goto LAB_00149a9c;
LAB_0014a125:
            psStack_258 = (secp256k1_modinv64_signed62 *)0x14a12a;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar11 = extraout_RAX_05;
            lVar39 = extraout_RDX_06;
LAB_0014a12a:
            psVar8 = (secp256k1_gej *)((-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0));
            psVar28 = (secp256k1_gej *)
                      (((long)psVar20 - (long)psVar8) - (ulong)(psVar32 < (secp256k1_gej *)-uVar11))
            ;
            if ((SBORROW8((long)psVar20,(long)psVar8) !=
                SBORROW8((long)psVar20 - (long)psVar8,(ulong)(psVar32 < (secp256k1_gej *)-uVar11)))
                == (long)psVar28 < 0) goto LAB_00149acd;
LAB_0014a14c:
            psStack_258 = (secp256k1_modinv64_signed62 *)0x14a151;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_0014a151:
            lVar21 = (-0x8000000000000000 - (long)psVar32) -
                     (ulong)(psVar20 != (secp256k1_gej *)0x0);
            lVar39 = (long)psVar34 - lVar21;
            psVar36 = psVar23;
            if ((SBORROW8((long)psVar34,lVar21) !=
                SBORROW8(lVar39,(ulong)(psVar23 < (secp256k1_gej *)-(long)psVar20))) ==
                (long)(lVar39 - (ulong)(psVar23 < (secp256k1_gej *)-(long)psVar20)) < 0)
            goto LAB_00149c6c;
LAB_0014a173:
            psStack_258 = (secp256k1_modinv64_signed62 *)0x14a178;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar11 = extraout_RAX_06;
            lVar39 = extraout_RDX_07;
            psVar36 = psVar23;
LAB_0014a178:
            psVar18 = (secp256k1_modinv64_signed62 *)
                      ((-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0));
            psVar35 = (secp256k1_gej *)
                      (((long)psVar28 - (long)psVar18) - (ulong)(psVar8 < (secp256k1_gej *)-uVar11))
            ;
            psVar23 = psVar20;
            psVar34 = psVar32;
            if ((SBORROW8((long)psVar28,(long)psVar18) !=
                SBORROW8((long)psVar28 - (long)psVar18,(ulong)(psVar8 < (secp256k1_gej *)-uVar11)))
                == (long)psVar35 < 0) goto LAB_00149c9d;
LAB_0014a19a:
            psStack_258 = (secp256k1_modinv64_signed62 *)0x14a19f;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_0014a19f:
            lVar21 = (-0x8000000000000000 - (long)psVar24) -
                     (ulong)(psVar33 != (secp256k1_gej *)0x0);
            lVar39 = (long)psVar35 - lVar21;
            if ((SBORROW8((long)psVar35,lVar21) !=
                SBORROW8(lVar39,(ulong)(psVar36 < (secp256k1_gej *)-(long)psVar33))) ==
                (long)(lVar39 - (ulong)(psVar36 < (secp256k1_gej *)-(long)psVar33)) < 0)
            goto LAB_00149e34;
LAB_0014a1c1:
            psStack_258 = (secp256k1_modinv64_signed62 *)0x14a1c6;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar11 = extraout_RAX_07;
            lVar39 = extraout_RDX_08;
LAB_0014a1c6:
            lVar22 = (-0x8000000000000000 - lVar39) - (ulong)(uVar11 != 0);
            lVar21 = (long)psVar20 - lVar22;
            psVar35 = psVar24;
            psVar36 = psVar33;
            if ((SBORROW8((long)psVar20,lVar22) !=
                SBORROW8(lVar21,(ulong)(psVar32 < (secp256k1_gej *)-uVar11))) !=
                (long)(lVar21 - (ulong)(psVar32 < (secp256k1_gej *)-uVar11)) < 0) break;
          } while( true );
        }
        psStack_258 = (secp256k1_modinv64_signed62 *)0x14a1ed;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_0014a1ed;
      }
      uVar12 = (ulong)((secp256k1_gej *)(-(long)puVar14 - 1U) < psVar28);
      lVar22 = (0x7fffffffffffffff - (long)psVar23) - (long)psVar20;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar23,(long)psVar20) != SBORROW8(lVar22,uVar12)) !=
          (long)(lVar22 - uVar12) < 0) goto LAB_00149af0;
LAB_0014992f:
      psVar40 = (secp256k1_modinv64_signed62 *)((ulong)psVar40 & uStack_250);
      psVar26 = (secp256k1_gej *)
                ((long)psVar40 +
                (((ulong)psVar26 & (ulong)psStack_248) -
                ((long)psVar40->v + uVar11 * (long)psVar8 + ((ulong)psVar26 & (ulong)psStack_248) &
                0x3fffffffffffffff)));
      bVar41 = CARRY8((ulong)puVar14,(ulong)psVar28);
      puVar14 = (uint64_t *)((long)(psVar28->x).n + (long)puVar14);
      psVar23 = (secp256k1_gej *)((long)(psVar20->x).n + (long)(psVar23->x).n + (ulong)bVar41);
      uVar11 = (long)psVar26 * lVar39;
      lVar39 = SUB168(SEXT816((long)psVar26) * SEXT816(lVar39),8);
      if (lVar39 < 0) goto LAB_00149af5;
      uVar12 = (ulong)((secp256k1_gej *)(-uVar11 - 1) < psVar8);
      lVar22 = (0x7fffffffffffffff - lVar39) - lVar21;
      if ((SBORROW8(0x7fffffffffffffff - lVar39,lVar21) != SBORROW8(lVar22,uVar12)) !=
          (long)(lVar22 - uVar12) < 0) goto LAB_00149b17;
LAB_0014997f:
      bVar41 = CARRY8(uVar11,(ulong)psVar8);
      uVar11 = (long)(psVar8->x).n + uVar11;
      lVar39 = lVar39 + lVar21 + (ulong)bVar41;
      if (((ulong)puVar14 & 0x3fffffffffffffff) != 0) goto LAB_0014a20b;
      psVar18 = psVar40;
      if ((uVar11 & 0x3fffffffffffffff) == 0) {
        uVar12 = (ulong)puVar14 >> 0x3e | (long)psVar23 << 2;
        psVar8 = (secp256k1_gej *)(uStack_240 * uStack_1f8 + uVar12);
        psVar28 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_240) * SEXT816((long)uStack_1f8),8) +
                   ((long)psVar23 >> 0x3e) + (ulong)CARRY8(uStack_240 * uStack_1f8,uVar12));
        uVar12 = (long)psStack_238 * (long)psStack_1e0;
        lVar21 = SUB168(SEXT816((long)psStack_238) * SEXT816((long)psStack_1e0),8);
        psVar23 = psStack_1e0;
        if (lVar21 < 0) goto LAB_00149b1c;
        psVar20 = (secp256k1_gej *)(-1 - uVar12);
        lVar22 = (0x7fffffffffffffff - lVar21) - (long)psVar28;
        psVar32 = (secp256k1_gej *)(lVar22 - (ulong)(psVar20 < psVar8));
        if ((SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar28) !=
            SBORROW8(lVar22,(ulong)(psVar20 < psVar8))) != (long)psVar32 < 0) goto LAB_00149b41;
        goto LAB_00149a02;
      }
      goto LAB_0014a210;
    }
  }
  iVar6 = (int)uVar29;
  psStack_258 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar40 = &sStack_2b8;
  psStack_268 = psVar27;
  psStack_260 = a_01;
  psStack_258 = psVar18;
  secp256k1_modinv64_mul_62(&sStack_290,(secp256k1_modinv64_signed62 *)psVar20,iVar6,1);
  psVar18 = a_00;
  secp256k1_modinv64_mul_62(&sStack_2b8,a_00,5,(int64_t)psVar26);
  lVar39 = 0;
  while ((ulong)sStack_290.v[lVar39] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_2b8.v[lVar39]) goto LAB_0014a2d7;
    lVar39 = lVar39 + 1;
    if (lVar39 == 4) {
      uVar7 = 4;
      while( true ) {
        if (sStack_290.v[uVar7] < sStack_2b8.v[uVar7]) {
          return -1;
        }
        if (sStack_2b8.v[uVar7] < sStack_290.v[uVar7]) break;
        bVar41 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar41) {
          return 0;
        }
      }
      return 1;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014a2d7:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar6 = (int)psVar40;
  if (iVar6 < 1) {
LAB_0014a584:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014a589:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014a58e:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014a593:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0014a598:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014a59d:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar26->x).n[0];
    uVar2 = (psVar26->x).n[1];
    lVar39 = psVar18->v[0];
    lVar21 = *extraout_RDX_09;
    uVar29 = lVar39 * uVar1;
    lVar30 = SUB168(SEXT816(lVar39) * SEXT816((long)uVar1),8);
    uVar11 = lVar21 * uVar2;
    lVar25 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar2),8);
    lVar22 = (0x7fffffffffffffff - lVar25) - lVar30;
    if ((SBORROW8(0x7fffffffffffffff - lVar25,lVar30) != SBORROW8(lVar22,(ulong)(~uVar11 < uVar29)))
        != (long)(lVar22 - (ulong)(~uVar11 < uVar29)) < 0 && -1 < lVar25) goto LAB_0014a59d;
    uVar3 = (psVar26->x).n[2];
    uVar4 = (psVar26->x).n[3];
    lVar30 = lVar25 + lVar30 + (ulong)CARRY8(uVar11,uVar29);
    uVar13 = lVar39 * uVar3;
    lVar22 = SUB168(SEXT816(lVar39) * SEXT816((long)uVar3),8);
    uVar15 = lVar21 * uVar4;
    lVar21 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar4),8);
    uVar12 = (ulong)(-uVar15 - 1 < uVar13);
    lVar39 = (0x7fffffffffffffff - lVar21) - lVar22;
    if ((SBORROW8(0x7fffffffffffffff - lVar21,lVar22) != SBORROW8(lVar39,uVar12)) ==
        (long)(lVar39 - uVar12) < 0 || lVar21 < 0) {
      lVar39 = lVar21 + lVar22 + (ulong)CARRY8(uVar15,uVar13);
      if ((uVar11 + uVar29 & 0x3fffffffffffffff) != 0) goto LAB_0014a589;
      if ((uVar15 + uVar13 & 0x3fffffffffffffff) != 0) goto LAB_0014a58e;
      uVar12 = uVar15 + uVar13 >> 0x3e | lVar39 * 4;
      uVar29 = uVar11 + uVar29 >> 0x3e | lVar30 * 4;
      lVar39 = lVar39 >> 0x3e;
      lVar30 = lVar30 >> 0x3e;
      if (iVar6 != 1) {
        psVar40 = (secp256k1_modinv64_signed62 *)((ulong)psVar40 & 0xffffffff);
        psVar19 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar21 = psVar18->v[(long)psVar19];
          uVar13 = lVar21 * uVar1 + uVar29;
          lVar25 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar1),8) + lVar30 +
                   (ulong)CARRY8(lVar21 * uVar1,uVar29);
          lVar22 = extraout_RDX_09[(long)psVar19];
          uVar11 = lVar22 * uVar2;
          lVar30 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar2),8);
          if (-1 < lVar30) {
            uVar29 = (ulong)(-uVar11 - 1 < uVar13);
            lVar5 = (0x7fffffffffffffff - lVar30) - lVar25;
            if ((SBORROW8(0x7fffffffffffffff - lVar30,lVar25) != SBORROW8(lVar5,uVar29)) ==
                (long)(lVar5 - uVar29) < 0) goto LAB_0014a473;
LAB_0014a57a:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014a57f:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0014a584;
          }
          lVar37 = (-0x8000000000000000 - lVar30) - (ulong)(uVar11 != 0);
          lVar5 = lVar25 - lVar37;
          if ((SBORROW8(lVar25,lVar37) != SBORROW8(lVar5,(ulong)(uVar13 < -uVar11))) !=
              (long)(lVar5 - (ulong)(uVar13 < -uVar11)) < 0) goto LAB_0014a57a;
LAB_0014a473:
          lVar30 = lVar25 + lVar30 + (ulong)CARRY8(uVar13,uVar11);
          uVar38 = lVar21 * uVar3 + uVar12;
          lVar21 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar3),8) + lVar39 +
                   (ulong)CARRY8(lVar21 * uVar3,uVar12);
          uVar15 = lVar22 * uVar4;
          lVar39 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar4),8);
          if (lVar39 < 0) {
            lVar25 = (-0x8000000000000000 - lVar39) - (ulong)(uVar15 != 0);
            lVar22 = lVar21 - lVar25;
            if ((SBORROW8(lVar21,lVar25) != SBORROW8(lVar22,(ulong)(uVar38 < -uVar15))) !=
                (long)(lVar22 - (ulong)(uVar38 < -uVar15)) < 0) goto LAB_0014a57f;
          }
          else {
            uVar29 = (ulong)(-uVar15 - 1 < uVar38);
            lVar22 = (0x7fffffffffffffff - lVar39) - lVar21;
            if ((SBORROW8(0x7fffffffffffffff - lVar39,lVar21) != SBORROW8(lVar22,uVar29)) !=
                (long)(lVar22 - uVar29) < 0) goto LAB_0014a57f;
          }
          lVar39 = lVar21 + lVar39 + (ulong)CARRY8(uVar38,uVar15);
          uVar29 = lVar30 * 4 | uVar13 + uVar11 >> 0x3e;
          psVar18->v[(long)((long)psVar19[-1].v + 0x27)] = uVar13 + uVar11 & 0x3fffffffffffffff;
          uVar12 = lVar39 * 4 | uVar38 + uVar15 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar19[-1].v + 0x27)] = uVar38 + uVar15 & 0x3fffffffffffffff
          ;
          psVar19 = (secp256k1_modinv64_signed62 *)((long)psVar19->v + 1);
          lVar39 = lVar39 >> 0x3e;
          lVar30 = lVar30 >> 0x3e;
        } while (psVar40 != psVar19);
      }
      if (lVar30 + -1 + (ulong)(0x7fffffffffffffff < uVar29) != -1) goto LAB_0014a593;
      psVar18->v[(long)iVar6 + -1] = uVar29;
      if (lVar39 + -1 + (ulong)(0x7fffffffffffffff < uVar12) == -1) {
        lVar39 = (long)iVar6 + -1;
        extraout_RDX_09[lVar39] = uVar12;
        return (int)lVar39;
      }
      goto LAB_0014a598;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar39 = psVar40->v[0];
  lVar21 = psVar40->v[1];
  psVar19 = (secp256k1_modinv64_signed62 *)psVar40->v[2];
  lVar22 = psVar40->v[3];
  lVar30 = psVar40->v[4];
  lVar25 = 0;
  do {
    if (psVar40->v[lVar25] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
      psVar31 = psVar19;
LAB_0014a7d3:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014a7d8;
    }
    psVar31 = psVar19;
    if (0x3fffffffffffffff < psVar40->v[lVar25]) goto LAB_0014a7d3;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 5);
  psVar31 = psVar40;
  iVar6 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,-2);
  if (iVar6 < 1) {
LAB_0014a7d8:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014a7dd:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014a7e2:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    psVar31 = psVar40;
    iVar6 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,1);
    if (-1 < iVar6) goto LAB_0014a7dd;
    uVar29 = lVar30 >> 0x3f;
    uVar13 = (long)psVar18 >> 0x3f;
    uVar11 = ((uVar29 & b->v[0]) + lVar39 ^ uVar13) - uVar13;
    uVar15 = ((long)uVar11 >> 0x3e) + (((uVar29 & b->v[1]) + lVar21 ^ uVar13) - uVar13);
    uVar38 = ((long)uVar15 >> 0x3e) + (((long)psVar19->v + (uVar29 & b->v[2]) ^ uVar13) - uVar13);
    uVar12 = ((long)uVar38 >> 0x3e) + (((uVar29 & b->v[3]) + lVar22 ^ uVar13) - uVar13);
    lVar39 = ((long)uVar12 >> 0x3e) + (((uVar29 & b->v[4]) + lVar30 ^ uVar13) - uVar13);
    uVar13 = lVar39 >> 0x3f;
    uVar29 = (b->v[0] & uVar13) + (uVar11 & 0x3fffffffffffffff);
    psVar31 = (secp256k1_modinv64_signed62 *)((b->v[4] & uVar13) + lVar39);
    uVar15 = ((long)uVar29 >> 0x3e) + (b->v[1] & uVar13) + (uVar15 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar15 >> 0x3e) + (b->v[2] & uVar13) + (uVar38 & 0x3fffffffffffffff);
    uVar12 = ((long)uVar11 >> 0x3e) + (b->v[3] & uVar13) + (uVar12 & 0x3fffffffffffffff);
    uVar13 = (long)psVar31->v + ((long)uVar12 >> 0x3e);
    psVar40->v[0] = uVar29 & 0x3fffffffffffffff;
    psVar40->v[1] = uVar15 & 0x3fffffffffffffff;
    psVar40->v[2] = uVar11 & 0x3fffffffffffffff;
    psVar40->v[3] = uVar12 & 0x3fffffffffffffff;
    psVar40->v[4] = uVar13;
    if (0x3fffffffffffffff < uVar13) goto LAB_0014a7e2;
    psVar31 = psVar40;
    iVar6 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,0);
    if (-1 < iVar6) {
      iVar6 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,1);
      if (iVar6 < 0) {
        return iVar6;
      }
      goto LAB_0014a7ec;
    }
  }
  psVar40 = psVar31;
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014a7ec:
  secp256k1_modinv64_normalize_62_cold_1();
  if ((long)psVar40 < 1) {
    psVar40 = (secp256k1_modinv64_signed62 *)-(long)psVar40;
  }
  return (int)psVar40;
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r;
    SECP256K1_FE_VERIFY(x);
    SECP256K1_GEJ_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    return secp256k1_fe_equal(&r, &a->x);
}